

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  string local_38;
  string *local_18;
  string *content_type;
  Request *this_local;
  
  content_type = &this->method;
  get_header_value_abi_cxx11_(&local_38,this,"Content-Type",0);
  local_18 = &local_38;
  lVar1 = std::__cxx11::string::rfind((char *)&local_38,0x1c2eb1);
  std::__cxx11::string::~string((string *)&local_38);
  return (bool)((lVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}